

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t lod,uint32_t tex)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  SPIRType *pSVar5;
  CompilerError *pCVar6;
  uint *ts_1;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_register_00000084;
  char *type;
  string type_prefix;
  string local_50;
  
  ts_1 = &switchD_0021a390::switchdataD_0030341c;
  pSVar5 = (SPIRType *)0x306545;
  switch((imgtype->image).dim) {
  case Dim1D:
    pSVar5 = (SPIRType *)0x30652e;
    pcVar7 = "iimage1DArray";
    goto LAB_0021a3b2;
  case Dim2D:
    pcVar7 = "iimage2DArray";
LAB_0021a3b2:
    ts_1 = (uint *)(pcVar7 + 6);
    if (((this->options).es & 1U) != 0) {
      ts_1 = (uint *)pSVar5;
    }
    type = (char *)ts_1;
    if ((imgtype->image).arrayed == false) {
      ts_1 = (uint *)pSVar5;
      type = (char *)pSVar5;
    }
    goto LAB_0021a3f8;
  case Dim3D:
    pSVar5 = (SPIRType *)0x306584;
    break;
  case DimCube:
    pSVar5 = (SPIRType *)0x30659a;
    break;
  case DimRect:
    pSVar5 = (SPIRType *)0x306577;
    break;
  case DimBuffer:
    pSVar5 = (SPIRType *)0x30658d;
    break;
  case DimSubpassData:
    break;
  default:
    pSVar5 = (SPIRType *)0x303078;
    ts_1 = (uint *)imgtype;
  }
  type = (char *)pSVar5;
LAB_0021a3f8:
  bVar2 = check_explicit_lod_allowed(this,lod);
  bVar3 = ::std::operator==(op,"textureLod");
  if ((((bVar3) || (bVar3 = ::std::operator==(op,"textureProjLod"), bVar3)) ||
      (bVar3 = ::std::operator==(op,"textureGrad"), bVar3)) ||
     (bVar3 = ::std::operator==(op,"textureProjGrad"), bVar3)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      if (bVar2) {
        ::std::__cxx11::string::string
                  ((string *)&type_prefix,"GL_EXT_shader_texture_lod",(allocator *)&local_50);
        require_extension_internal(this,&type_prefix);
LAB_0021a4c1:
        ::std::__cxx11::string::~string((string *)&type_prefix);
      }
    }
    else {
      bVar3 = is_legacy(this);
      if (bVar3) {
        ::std::__cxx11::string::string
                  ((string *)&type_prefix,"GL_ARB_shader_texture_lod",(allocator *)&local_50);
        require_extension_internal(this,&type_prefix);
        goto LAB_0021a4c1;
      }
    }
  }
  bVar3 = ::std::operator==(op,"textureLodOffset");
  if ((bVar3) || (bVar3 = ::std::operator==(op,"textureProjLodOffset"), bVar3)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                (&type_prefix,(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])ts_1);
      CompilerError::CompilerError(pCVar6,&type_prefix);
      __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_prefix,"GL_EXT_gpu_shader4",(allocator *)&local_50);
    require_extension_internal(this,&type_prefix);
    ::std::__cxx11::string::~string((string *)&type_prefix);
  }
  bVar3 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  if (((bVar3) && ((this->options).es == true)) && ((this->options).version < 300)) {
    bVar3 = ::std::operator==(op,"texture");
    if ((!bVar3) && (bVar3 = ::std::operator==(op,"textureProj"), !bVar3)) {
      pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                (&type_prefix,(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])ts_1);
      CompilerError::CompilerError(pCVar6,&type_prefix);
      __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_prefix,"GL_EXT_shadow_samplers",(allocator *)&local_50);
    require_extension_internal(this,&type_prefix);
    ::std::__cxx11::string::~string((string *)&type_prefix);
  }
  bVar3 = false;
  if (((this->options).es == true) && (bVar3 = false, (this->options).version < 300)) {
    bVar3 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  }
  bVar4 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  pcVar7 = "shadow";
  pcVar8 = "texture";
  if (bVar4) {
    pcVar8 = "shadow";
  }
  ::std::__cxx11::string::string((string *)&type_prefix,pcVar8,(allocator *)&local_50);
  bVar4 = ::std::operator==(op,"texture");
  if (bVar4) {
    if (bVar3 != false) {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char **)0x3080dc,(char (*) [4])CONCAT44(in_register_00000084,lod));
      goto LAB_0021a822;
    }
  }
  else {
    bVar4 = ::std::operator==(op,"textureLod");
    if (bVar4) {
      if (bVar2) {
        local_50._M_dataplus._M_p = "LodEXT";
        if (299 < (this->options).version) {
          local_50._M_dataplus._M_p = "Lod";
        }
        if ((this->options).es == false) {
          local_50._M_dataplus._M_p = "Lod";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_0021a822;
      }
    }
    else {
      bVar4 = ::std::operator==(op,"textureProj");
      if (bVar4) {
        local_50._M_dataplus._M_p = "Proj";
        if (bVar3 != false) {
          local_50._M_dataplus._M_p = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_0021a822;
      }
      bVar3 = ::std::operator==(op,"textureGrad");
      if (bVar3) {
        uVar1 = (this->options).version;
        pcVar7 = "GradARB";
        if (0x81 < uVar1) {
          pcVar7 = "Grad";
        }
        bVar2 = (this->options).es;
        if (bVar2 != false) {
          pcVar7 = "Grad";
        }
        local_50._M_dataplus._M_p = "GradEXT";
        if (299 < uVar1) {
          local_50._M_dataplus._M_p = pcVar7;
        }
        if (bVar2 == false) {
          local_50._M_dataplus._M_p = pcVar7;
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_0021a822;
      }
      bVar3 = ::std::operator==(op,"textureProjLod");
      if (bVar3) {
        if (bVar2) {
          local_50._M_dataplus._M_p = "ProjLodEXT";
          if (299 < (this->options).version) {
            local_50._M_dataplus._M_p = "ProjLod";
          }
          if ((this->options).es == false) {
            local_50._M_dataplus._M_p = "ProjLod";
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        }
        else {
          join<std::__cxx11::string&,char_const*&,char_const(&)[5]>
                    (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     (char **)0x3062a1,(char (*) [5])CONCAT44(in_register_00000084,lod));
        }
        goto LAB_0021a822;
      }
      bVar3 = ::std::operator==(op,"textureLodOffset");
      if (!bVar3) {
        bVar3 = ::std::operator==(op,"textureProjGrad");
        if (bVar3) {
          uVar1 = (this->options).version;
          pcVar7 = "ProjGradARB";
          if (0x81 < uVar1) {
            pcVar7 = "ProjGrad";
          }
          bVar2 = (this->options).es;
          if (bVar2 != false) {
            pcVar7 = "ProjGrad";
          }
          local_50._M_dataplus._M_p = "ProjGradEXT";
          if (299 < uVar1) {
            local_50._M_dataplus._M_p = pcVar7;
          }
          if (bVar2 == false) {
            local_50._M_dataplus._M_p = pcVar7;
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        }
        else {
          bVar3 = ::std::operator==(op,"textureProjLodOffset");
          if (!bVar3) {
            pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
            join<char_const(&)[32],std::__cxx11::string_const&>
                      (&local_50,(spirv_cross *)"Unsupported legacy texture op: ",(char (*) [32])op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7);
            CompilerError::CompilerError(pCVar6,&local_50);
            __cxa_throw(pCVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar2) {
            join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                      (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       (char **)0x3062e2,(char (*) [14])CONCAT44(in_register_00000084,lod));
          }
          else {
            join<std::__cxx11::string&,char_const*&,char_const(&)[11]>
                      (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       (char **)0x3062f7,(char (*) [11])CONCAT44(in_register_00000084,lod));
          }
        }
        goto LAB_0021a822;
      }
      if (bVar2) {
        join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                  (__return_storage_ptr__,(spirv_cross *)&type_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char **)0x306282,(char (*) [10])CONCAT44(in_register_00000084,lod));
        goto LAB_0021a822;
      }
    }
  }
  join<std::__cxx11::string&,char_const*&>
            (__return_storage_ptr__,(spirv_cross *)&type_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
             (char **)pcVar7);
LAB_0021a822:
  ::std::__cxx11::string::~string((string *)&type_prefix);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t lod, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	bool use_explicit_lod = check_explicit_lod_allowed(lod);

	if (op == "textureLod" || op == "textureProjLod" || op == "textureGrad" || op == "textureProjGrad")
	{
		if (is_legacy_es())
		{
			if (use_explicit_lod)
				require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	if (image_is_comparison(imgtype, tex) && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	bool is_es_and_depth = is_legacy_es() && image_is_comparison(imgtype, tex);
	std::string type_prefix = image_is_comparison(imgtype, tex) ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "LodEXT" : "Lod");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "ProjLodEXT" : "ProjLod");
		else
			return join(type_prefix, type, "Proj");
	}
	else if (op == "textureLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "LodOffset");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "ProjLodOffset");
		else
			return join(type_prefix, type, "ProjOffset");
	}
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}